

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O3

size_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::parameterIdx(Group *this,string *parameterName)

{
  int iVar1;
  Parameter *this_00;
  string *psVar2;
  invalid_argument *this_01;
  long *plVar3;
  size_type *psVar4;
  size_t idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->_parameters).
      super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_parameters).
      super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    idx = 0;
    do {
      this_00 = parameter(this,idx);
      psVar2 = Parameter::name_abi_cxx11_(this_00);
      iVar1 = std::__cxx11::string::compare((string *)psVar2);
      if (iVar1 == 0) {
        return idx;
      }
      idx = idx + 1;
    } while (idx < (ulong)(((long)(this->_parameters).
                                  super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_parameters).
                                  super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          0x2e8ba2e8ba2e8ba3));
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_88,"Group::parameterIdx could not find ",parameterName);
  plVar3 = (long *)std::__cxx11::string::append((char *)&bStack_88);
  local_68._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_68._M_dataplus._M_p == psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_48,&local_68,&this->_name);
  std::invalid_argument::invalid_argument(this_01,(string *)&local_48);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t ezc3d::ParametersNS::GroupNS::Group::parameterIdx(
    const std::string &parameterName) const {
  for (size_t i = 0; i < nbParameters(); ++i)
    if (!parameter(i).name().compare(parameterName))
      return i;
  throw std::invalid_argument("Group::parameterIdx could not find " +
                              parameterName + " in the group " + name());
}